

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType ValueType::GetObject(ObjectType objectType)

{
  ValueType VVar1;
  ValueType local_14;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12 [4];
  ValueType valueType;
  
  local_12[0].bits = Object;
  SetObjectType((ValueType *)&local_12[0].field_0,objectType);
  if ((ushort)(objectType - ObjectWithArray) < 2) {
    SetHasNoMissingValues((ValueType *)&local_12[0].field_0,false);
    local_12[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         SetArrayTypeId(&local_14,TypeIds_Array);
  }
  VVar1 = Verify((ValueType)local_12[0].field_0);
  return (ValueType)VVar1.field_0;
}

Assistant:

ValueType ValueType::GetObject(const ObjectType objectType)
{
    ValueType valueType(UninitializedObject);
    valueType.SetObjectType(objectType);
    if(objectType == ObjectType::Array || objectType == ObjectType::ObjectWithArray)
    {
        // Default to the most conservative array-specific information. This just a safeguard to guarantee that the returned
        // value type has a valid set of array-specific information. Callers should not rely on these defaults, and should
        // instead always set each piece of information explicitly.
        valueType = valueType.SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array);
    }
    return Verify(valueType);
}